

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

FillerParameter * __thiscall caffe::PReLUParameter::mutable_filler(PReLUParameter *this)

{
  FillerParameter *this_00;
  PReLUParameter *this_local;
  
  set_has_filler(this);
  if (this->filler_ == (FillerParameter *)0x0) {
    this_00 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(this_00);
    this->filler_ = this_00;
  }
  return this->filler_;
}

Assistant:

inline ::caffe::FillerParameter* PReLUParameter::mutable_filler() {
  set_has_filler();
  if (filler_ == NULL) {
    filler_ = new ::caffe::FillerParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.PReLUParameter.filler)
  return filler_;
}